

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O0

void __thiscall QGraphicsView::drawBackground(QGraphicsView *this,QPainter *painter,QRectF *rect)

{
  long lVar1;
  bool bVar2;
  BrushStyle BVar3;
  QGraphicsScene *pQVar4;
  QBrush *in_RDX;
  QPainter *in_RSI;
  long in_FS_OFFSET;
  bool wasAa;
  QGraphicsViewPrivate *d;
  undefined8 in_stack_ffffffffffffffb8;
  RenderHint hint;
  QPainter *in_stack_ffffffffffffffc0;
  bool local_10;
  bool local_c;
  
  hint = (RenderHint)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  d_func((QGraphicsView *)0xa407cf);
  bVar2 = ::QPointer::operator_cast_to_bool((QPointer<QGraphicsScene> *)0xa407e5);
  if ((bVar2) && (BVar3 = QBrush::style((QBrush *)0xa407fc), BVar3 == NoBrush)) {
    pQVar4 = QPointer<QGraphicsScene>::operator->((QPointer<QGraphicsScene> *)0xa40812);
    (**(code **)(*(long *)pQVar4 + 0xe8))(pQVar4,in_RSI,in_RDX);
  }
  else {
    bVar2 = QPainter::testRenderHint(in_stack_ffffffffffffffc0,hint);
    if (bVar2) {
      in_stack_ffffffffffffffc0 = in_RSI;
      QFlags<QPainter::RenderHint>::QFlags((QFlags<QPainter::RenderHint> *)in_RSI,hint);
      QPainter::setRenderHints((QFlags_conflict1 *)in_stack_ffffffffffffffc0,local_c);
    }
    QPainter::fillRect((QRectF *)in_RSI,in_RDX);
    if (bVar2) {
      QFlags<QPainter::RenderHint>::QFlags
                ((QFlags<QPainter::RenderHint> *)in_stack_ffffffffffffffc0,
                 (RenderHint)((ulong)in_RSI >> 0x20));
      QPainter::setRenderHints((QFlags_conflict1 *)in_RSI,local_10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsView::drawBackground(QPainter *painter, const QRectF &rect)
{
    Q_D(QGraphicsView);
    if (d->scene && d->backgroundBrush.style() == Qt::NoBrush) {
        d->scene->drawBackground(painter, rect);
        return;
    }

    const bool wasAa = painter->testRenderHint(QPainter::Antialiasing);
    if (wasAa)
        painter->setRenderHints(QPainter::Antialiasing, false);
    painter->fillRect(rect, d->backgroundBrush);
    if (wasAa)
        painter->setRenderHints(QPainter::Antialiasing, true);
}